

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O0

void __thiscall
TPZGenSubStruct::InitializeDohrCondense
          (TPZGenSubStruct *this,TPZAutoPointer<TPZMatrix<double>_> *dohrmatrix,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assembly)

{
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this_00;
  int iVar1;
  TPZMatrix<double> *pTVar2;
  TPZCompMesh *pTVar3;
  int64_t iVar4;
  size_type sVar5;
  TPZSubCompMesh *pTVar6;
  TPZDohrSubstructCondense<double> *pTVar7;
  TPZDohrAssembly<double> *pTVar8;
  TPZVec<int> *pTVar9;
  pair<int,_int> *ppVar10;
  mapped_type *gatherpermute;
  int *piVar11;
  TPZDohrSubstructCondense<double> *pTVar12;
  TPZAutoPointer *in_RDX;
  TPZAutoPointer<TPZMatrix<double>_> *in_RSI;
  long in_RDI;
  int count;
  int nel;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *in_stack_00000208;
  TPZSubCompMesh *in_stack_00000210;
  TPZVec<int> *fromexternal;
  TPZVec<int> *toexternal;
  ENumbering tint;
  ENumbering text;
  ENumbering tsub;
  int ieq;
  int next;
  TPZVec<std::pair<int,_int>_> globaleqs;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> globinv;
  int neq_1;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> substruct;
  TPZSubCompMesh *submesh;
  int isub;
  int nsub;
  int neq;
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *dohr;
  TPZAutoPointer<TPZCompMesh> *in_stack_fffffffffffffd08;
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *in_stack_fffffffffffffd10;
  TPZDohrSubstructCondense<double> *in_stack_fffffffffffffd28;
  TPZVec<int> *in_stack_fffffffffffffd30;
  TPZCompMesh *in_stack_fffffffffffffd40;
  mapped_type *in_stack_fffffffffffffd48;
  map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
  *in_stack_fffffffffffffd50;
  TPZSubCompMesh *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  TPZVec<std::pair<int,_int>_> *in_stack_fffffffffffffd90;
  TPZSubCompMesh *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int64_t in_stack_fffffffffffffdd8;
  TPZVec<TPZVec<int>_> *in_stack_fffffffffffffde0;
  TPZVec<int> *in_stack_fffffffffffffe10;
  TPZVec<int> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *local_140;
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_108;
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_100;
  int local_f8;
  int local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_e8;
  TPZVec<std::pair<int,_int>_> *local_e0;
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_d8;
  undefined4 in_stack_ffffffffffffff38;
  ENumbering EVar13;
  ENumbering EVar14;
  ENumbering EVar15;
  int local_b8;
  TPZVec<std::pair<int,_int>_> local_b0 [2];
  int local_5c;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_58 [2];
  TPZSubCompMesh *local_48;
  int local_40;
  int local_28;
  int local_24;
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *local_20;
  
  pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->(in_RSI);
  if (pTVar2 == (TPZMatrix<double> *)0x0) {
    local_140 = (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *)0x0;
  }
  else {
    local_140 = (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *)
                __dynamic_cast(pTVar2,&TPZMatrix<double>::typeinfo,
                               &TPZDohrMatrix<double,TPZDohrSubstructCondense<double>>::typeinfo,0);
  }
  local_20 = local_140;
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  (**(code **)(*(long *)pTVar3 + 0x78))();
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  iVar4 = TPZCompMesh::NEquations(in_stack_fffffffffffffd40);
  local_24 = (int)iVar4;
  (*(local_20->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (local_20,(long)local_24);
  this_00 = local_20;
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2011820);
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::SetNumCornerEqs(this_00,(int)sVar5);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  iVar4 = NSubMesh((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffd40);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffd10);
  local_28 = (int)iVar4;
  TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
            ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_RDX);
  TPZVec<TPZVec<int>_>::Resize(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
            ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_RDX);
  TPZVec<TPZVec<int>_>::Resize(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::operator<<((ostream *)&std::cout,"Computing the system of equations for each substructure\n")
  ;
  for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
    TPZAutoPointer<TPZCompMesh>::TPZAutoPointer
              ((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    pTVar6 = SubMesh((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffd48,
                     (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
              ((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffd10);
    local_48 = pTVar6;
    if (pTVar6 != (TPZSubCompMesh *)0x0) {
      std::operator<<((ostream *)&std::cout,'*');
      std::ostream::flush();
      operator_new(0x450);
      TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense
                ((TPZDohrSubstructCondense<double> *)in_stack_fffffffffffffd70);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd28);
      iVar4 = TPZCompMesh::NEquations(in_stack_fffffffffffffd40);
      local_5c = (int)iVar4;
      pTVar7 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      pTVar7->fNEquations = (int)iVar4;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x2011a7d);
      TPZVec<std::pair<int,_int>_>::TPZVec(local_b0);
      IdentifyEqNumbers((TPZGenSubStruct *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                        (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      iVar4 = TPZVec<std::pair<int,_int>_>::NElements(local_b0);
      iVar1 = (int)iVar4;
      pTVar7 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      pTVar7->fNumExternalEquations = iVar1;
      pTVar8 = TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
                         ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_RDX);
      pTVar9 = TPZVec<TPZVec<int>_>::operator[](&pTVar8->fFineEqs,(long)local_40);
      (*pTVar9->_vptr_TPZVec[3])(pTVar9,(long)iVar1);
      for (local_b8 = 0; local_b8 < iVar1; local_b8 = local_b8 + 1) {
        ppVar10 = TPZVec<std::pair<int,_int>_>::operator[](local_b0,(long)local_b8);
        in_stack_fffffffffffffe24 = ppVar10->second;
        pTVar8 = TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
                           ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_RDX);
        in_stack_fffffffffffffe18 =
             TPZVec<TPZVec<int>_>::operator[](&pTVar8->fFineEqs,(long)local_40);
        in_stack_fffffffffffffe10 =
             (TPZVec<int> *)TPZVec<int>::operator[](in_stack_fffffffffffffe18,(long)local_b8);
        *(int *)&in_stack_fffffffffffffe10->_vptr_TPZVec = in_stack_fffffffffffffe24;
      }
      EVar15 = Submesh;
      EVar14 = ExternalFirst;
      EVar13 = InternalFirst;
      pTVar7 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      std::
      pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
      ::
      pair<TPZDohrSubstructCondense<double>::ENumbering_&,_TPZDohrSubstructCondense<double>::ENumbering_&,_true>
                (&local_d8,(ENumbering *)&stack0xffffffffffffff44,
                 (ENumbering *)&stack0xffffffffffffff40);
      gatherpermute =
           std::
           map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
           ::operator[](in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      std::
      pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
      ::
      pair<TPZDohrSubstructCondense<double>::ENumbering_&,_TPZDohrSubstructCondense<double>::ENumbering_&,_true>
                (&local_e8,(ENumbering *)&stack0xffffffffffffff40,
                 (ENumbering *)&stack0xffffffffffffff44);
      local_e0 = (TPZVec<std::pair<int,_int>_> *)
                 std::
                 map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                 ::operator[](in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
      local_ec = 0xffffffff;
      (*gatherpermute->_vptr_TPZVec[2])(gatherpermute,(long)local_5c,&local_ec);
      local_f0 = 0xffffffff;
      (*local_e0->_vptr_TPZVec[2])(local_e0,(long)local_5c,&local_f0);
      iVar4 = TPZVec<std::pair<int,_int>_>::NElements(local_b0);
      local_f4 = (int)iVar4;
      for (local_b8 = 0; local_b8 < local_f4; local_b8 = local_b8 + 1) {
        pTVar9 = gatherpermute;
        ppVar10 = TPZVec<std::pair<int,_int>_>::operator[](local_b0,(long)local_b8);
        piVar11 = TPZVec<int>::operator[](gatherpermute,(long)ppVar10->first);
        *piVar11 = local_b8;
        gatherpermute = pTVar9;
      }
      local_f8 = local_f4;
      local_f4 = local_f4 + 1;
      for (local_b8 = 0; local_b8 < local_5c; local_b8 = local_b8 + 1) {
        piVar11 = TPZVec<int>::operator[](gatherpermute,(long)local_b8);
        if (*piVar11 == -1) {
          in_stack_fffffffffffffda4 = local_f8;
          local_f8 = local_f8 + 1;
          piVar11 = TPZVec<int>::operator[](gatherpermute,(long)local_b8);
          *piVar11 = in_stack_fffffffffffffda4;
        }
      }
      for (local_b8 = 0; local_b8 < local_5c; local_b8 = local_b8 + 1) {
        in_stack_fffffffffffffd8c = local_b8;
        in_stack_fffffffffffffd90 = local_e0;
        in_stack_fffffffffffffd98 =
             (TPZSubCompMesh *)TPZVec<int>::operator[](gatherpermute,(long)local_b8);
        piVar11 = TPZVec<int>::operator[]
                            ((TPZVec<int> *)in_stack_fffffffffffffd90,
                             (long)*(int *)&in_stack_fffffffffffffd98->super_TPZCompMesh);
        *piVar11 = in_stack_fffffffffffffd8c;
      }
      in_stack_fffffffffffffd70 = local_48;
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      std::
      pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
      ::
      pair<TPZDohrSubstructCondense<double>::ENumbering_&,_TPZDohrSubstructCondense<double>::ENumbering_&,_true>
                (&local_100,(ENumbering *)&stack0xffffffffffffff44,
                 (ENumbering *)&stack0xffffffffffffff3c);
      std::
      map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
      ::operator[](in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
      pTVar12 = TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      in_stack_fffffffffffffd50 = &pTVar12->fPermutationsScatter;
      std::
      pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
      ::
      pair<TPZDohrSubstructCondense<double>::ENumbering_&,_TPZDohrSubstructCondense<double>::ENumbering_&,_true>
                (&local_108,(ENumbering *)&stack0xffffffffffffff3c,
                 (ENumbering *)&stack0xffffffffffffff44);
      in_stack_fffffffffffffd48 =
           std::
           map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
           ::operator[](in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
      ComputeInternalEquationPermutation
                ((TPZSubCompMesh *)CONCAT44(EVar15,EVar14),
                 (TPZVec<int> *)CONCAT44(EVar13,in_stack_ffffffffffffff38),gatherpermute);
      in_stack_fffffffffffffd40 =
           (TPZCompMesh *)TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(local_58);
      in_stack_fffffffffffffd30 = (TPZVec<int> *)&in_stack_fffffffffffffd40->fName;
      pTVar8 = TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
                         ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_RDX);
      in_stack_fffffffffffffd28 =
           (TPZDohrSubstructCondense<double> *)
           TPZVec<TPZVec<int>_>::operator[](&pTVar8->fCoarseEqs,(long)local_40);
      IdentifySubCornerEqs
                ((TPZGenSubStruct *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,(TPZVec<int> *)pTVar7);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd10,
                 (TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd08);
      ::TPZAutoPointer::operator_cast_to_TPZDohrAssembly_(in_RDX);
      InitializeMatrices(in_stack_00000210,in_stack_00000208,_count);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd10 = local_20;
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)local_20,
                 (TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd08);
      TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::AddSubstruct
                (in_stack_fffffffffffffd10,
                 (TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd08);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd10);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffffd10);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x201224a);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<double>_> *)in_stack_fffffffffffffd10);
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZGenSubStruct::InitializeDohrCondense(TPZAutoPointer<TPZMatrix<STATE> > dohrmatrix, TPZAutoPointer<TPZDohrAssembly<STATE> > assembly)
{
	//Isolate each subcompmesh and put it in the dohrmann matrix
	TPZDohrMatrix<STATE,TPZDohrSubstructCondense<STATE> > *dohr = dynamic_cast<TPZDohrMatrix<STATE,TPZDohrSubstructCondense<STATE> > *>(dohrmatrix.operator->());
	fCMesh->ComputeNodElCon();
	
	int neq = fCMesh->NEquations();
	dohr->Resize(neq,neq);
	// fCornerEqs was initialized during the mesh generation process
    dohr->SetNumCornerEqs(this->fCornerEqs.size());
	
	int nsub = NSubMesh(fCMesh);
	assembly->fFineEqs.Resize(nsub);
	assembly->fCoarseEqs.Resize(nsub);
	int isub;
	std::cout << "Computing the system of equations for each substructure\n";
	for(isub=0; isub<nsub; isub++)
	{
		TPZSubCompMesh *submesh = SubMesh(fCMesh, isub);
		if(!submesh) 
		{
			continue;
		}
		std::cout << '*';
		// creating the substructure HERE
		std::cout.flush();
		TPZAutoPointer<TPZDohrSubstructCondense<STATE> > substruct = new TPZDohrSubstructCondense<STATE>();

		// compute the stiffness matrix
		int neq = ((TPZCompMesh *)submesh)->NEquations();
		//    int neq = substruct->fStiffness->Rows();
		
		substruct->fNEquations = neq;

		// identify the equation numbers of the submesh
		std::map<int,int> globinv;
		// initialize the fGlobalIndex data structure
		// fGlobalIndex will have -1 entries for internal equations
		// we need to dismember this (again) in two vectors
		TPZVec<std::pair<int,int> > globaleqs;
		IdentifyEqNumbers(submesh, globaleqs ,globinv);
		int next = globaleqs.NElements();
		substruct->fNumExternalEquations = next;
		assembly->fFineEqs[isub].Resize(next);
		int ieq;
		for(ieq=0; ieq<next; ieq++)
		{
			assembly->fFineEqs[isub][ieq] = globaleqs[ieq].second; 
		}
		
		// initialize the permutations from the mesh enumeration to the external enumeration
		typedef TPZDohrSubstructCondense<STATE>::ENumbering ENumbering;
		typedef std::pair<ENumbering,ENumbering> Numberingpair;
		ENumbering tsub,text,tint;
		tsub = TPZDohrSubstructCondense<STATE>::Submesh;
		text = TPZDohrSubstructCondense<STATE>::ExternalFirst;
		tint = TPZDohrSubstructCondense<STATE>::InternalFirst;
		
		TPZVec<int> &toexternal = substruct->fPermutationsScatter[Numberingpair(tsub,text)];
		TPZVec<int> &fromexternal = substruct->fPermutationsScatter[Numberingpair(text,tsub)];
		toexternal.Resize(neq,-1);
		fromexternal.Resize(neq,-1);
		int nel = globaleqs.NElements();
		
		for(ieq=0; ieq<nel; ieq++)
		{
			toexternal[globaleqs[ieq].first] = ieq;
		}
		int count = nel++;
		for(ieq=0; ieq<neq; ieq++)
		{
			if(toexternal[ieq] == -1) toexternal[ieq] = count++;
		}
		for(ieq=0; ieq<neq; ieq++)
		{
			fromexternal[toexternal[ieq]] = ieq;
		}
		
		ComputeInternalEquationPermutation(submesh, substruct->fPermutationsScatter[Numberingpair(tsub,tint)], substruct->fPermutationsScatter[Numberingpair(tint,tsub)]);
		//		IdentifyEqNumbers(submesh, substruct->fGlobalIndex,globinv);
		
		// initialize the fC matrix
		// associate each column of the fC matrix with a coarse index
		IdentifySubCornerEqs(globinv,substruct->fCoarseNodes,assembly->fCoarseEqs[isub]);
		//		int ncoarse = substruct->fCoarseNodes.NElements();
		
		// reorder by internal nodes
		// the fInternalEqs data structure will not be filled if the connects are made internal
		
		// this permutes the nodes of the submesh
		// This is a lengthy process which should run on the remote processor
		InitializeMatrices(submesh, substruct,  assembly);
		
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "The coarse equations are " << assembly->fCoarseEqs[isub] << std::endl;
			/*      sout << "Submesh for element " << iel << std::endl;
			 submesh->Print(sout);*/
			sout << "Substructure for submesh " << isub << std::endl;
			substruct->Print(sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		dohr->AddSubstruct(substruct);
	}
	std::cout << std::endl;
}